

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O1

uint lodepng_huffman_code_lengths(uint *lengths,uint *frequencies,size_t numcodes,uint maxbitlen)

{
  BPMNode *pBVar1;
  size_t __size;
  uint uVar2;
  BPMNode *pBVar3;
  BPMNode *pBVar4;
  bool bVar5;
  BPMNode *pBVar6;
  undefined4 uVar7;
  bool bVar8;
  BPMNode *leaves;
  ulong uVar9;
  BPMNode *pBVar10;
  ulong uVar11;
  BPMNode **ppBVar12;
  BPMNode **ppBVar13;
  uint uVar14;
  BPMNode *pBVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  BPMLists lists;
  BPMLists local_80;
  size_t local_48;
  uint *local_40;
  BPMNode *local_38;
  
  if ((uint)(1 << ((byte)maxbitlen & 0x1f)) < (uint)numcodes || numcodes == 0) {
    return 0x50;
  }
  leaves = (BPMNode *)malloc(numcodes * 0x18);
  if (leaves == (BPMNode *)0x0) {
    return 0x53;
  }
  if (numcodes == 0) {
    uVar19 = 0;
  }
  else {
    uVar9 = 0;
    uVar19 = 0;
    do {
      if (frequencies[uVar9] != 0) {
        leaves[uVar19].weight = frequencies[uVar9];
        leaves[uVar19].index = (uint)uVar9;
        uVar19 = uVar19 + 1;
      }
      uVar9 = uVar9 + 1;
    } while ((uVar9 & 0xffffffff) != numcodes);
  }
  if (numcodes != 0) {
    memset(lengths,0,numcodes << 2);
  }
  if (uVar19 == 1) {
    uVar14 = leaves->index;
    lengths[uVar14] = 1;
    lengths[(ulong)uVar14 == 0] = 1;
  }
  else {
    if (uVar19 != 0) {
      __size = uVar19 * 0x18;
      local_40 = lengths;
      pBVar10 = (BPMNode *)malloc(__size);
      bVar5 = true;
      if (1 < uVar19) {
        uVar9 = 1;
        bVar8 = false;
        do {
          bVar5 = bVar8;
          pBVar15 = leaves;
          pBVar4 = pBVar10;
          if (!bVar5) {
            pBVar15 = pBVar10;
            pBVar4 = leaves;
          }
          uVar21 = uVar9 * 2;
          uVar17 = 0;
          do {
            uVar22 = uVar17 + uVar9;
            if (uVar19 <= uVar17 + uVar9) {
              uVar22 = uVar19;
            }
            uVar16 = uVar17 + uVar21;
            pBVar6 = pBVar15;
            uVar18 = uVar17;
            uVar20 = uVar22;
            uVar23 = uVar19;
            if (uVar16 < uVar19) {
              uVar23 = uVar16;
            }
            for (; uVar17 < uVar23; uVar17 = uVar17 + 1) {
              if ((uVar18 < uVar22) &&
                 ((uVar23 <= uVar20 || (pBVar4[uVar18].weight <= pBVar4[uVar20].weight)))) {
                uVar11 = uVar18 + 1;
              }
              else {
                uVar11 = uVar18;
                uVar18 = uVar20;
                uVar20 = uVar20 + 1;
              }
              uVar7 = *(undefined4 *)&pBVar4[uVar18].field_0x14;
              pBVar6->in_use = pBVar4[uVar18].in_use;
              *(undefined4 *)&pBVar6->field_0x14 = uVar7;
              pBVar1 = pBVar4 + uVar18;
              uVar14 = pBVar1->index;
              pBVar3 = pBVar1->tail;
              pBVar6->weight = pBVar1->weight;
              pBVar6->index = uVar14;
              pBVar6->tail = pBVar3;
              pBVar6 = pBVar6 + 1;
              uVar18 = uVar11;
            }
            pBVar15 = pBVar15 + uVar9 * 2;
            uVar17 = uVar16;
          } while (uVar16 < uVar19);
          uVar9 = uVar21;
          local_48 = __size;
          local_38 = leaves;
          bVar8 = (bool)(bVar5 ^ 1);
        } while (uVar21 < uVar19);
      }
      if (__size != 0 && !bVar5) {
        memcpy(leaves,pBVar10,__size);
      }
      free(pBVar10);
      uVar2 = (maxbitlen + 1) * maxbitlen * 2;
      local_80.nextfree = 0;
      local_80.memsize = uVar2;
      local_80.numfree = uVar2;
      local_80.listsize = maxbitlen;
      pBVar10 = (BPMNode *)malloc((ulong)uVar2 * 0x18);
      local_80.memory = pBVar10;
      ppBVar12 = (BPMNode **)malloc((ulong)uVar2 * 8);
      local_80.freelist = ppBVar12;
      ppBVar13 = (BPMNode **)malloc((ulong)maxbitlen << 3);
      local_80.chains0 = ppBVar13;
      local_80.chains1 = (BPMNode **)malloc((ulong)maxbitlen << 3);
      uVar14 = 0x53;
      if (((ppBVar13 != (BPMNode **)0x0 && ppBVar12 != (BPMNode **)0x0) && pBVar10 != (BPMNode *)0x0
          ) && local_80.chains1 != (BPMNode **)0x0) {
        if (uVar2 != 0) {
          uVar9 = 0;
          do {
            local_80.freelist[uVar9] = local_80.memory + uVar9;
            uVar9 = uVar9 + 1;
          } while (uVar9 != uVar2);
        }
        bpmnode_create(&local_80,leaves->weight,1,(BPMNode *)0x0);
        bpmnode_create(&local_80,leaves[1].weight,2,(BPMNode *)0x0);
        if ((ulong)local_80.listsize != 0) {
          uVar9 = 0;
          do {
            local_80.chains0[uVar9] = local_80.memory;
            local_80.chains1[uVar9] = local_80.memory + 1;
            uVar9 = uVar9 + 1;
          } while (local_80.listsize != uVar9);
        }
        uVar9 = uVar19 * 2 - 2;
        if (uVar9 != 2) {
          uVar21 = 2;
          do {
            boundaryPM(&local_80,leaves,uVar19,maxbitlen - 1,(int)uVar21);
            uVar21 = (ulong)((int)uVar21 + 1);
          } while (uVar9 != uVar21);
        }
        for (pBVar10 = local_80.chains1[maxbitlen - 1]; uVar14 = 0, pBVar10 != (BPMNode *)0x0;
            pBVar10 = pBVar10->tail) {
          if (pBVar10->index != 0) {
            uVar19 = 0;
            do {
              local_40[leaves[uVar19].index] = local_40[leaves[uVar19].index] + 1;
              uVar14 = (int)uVar19 + 1;
              uVar19 = (ulong)uVar14;
            } while (uVar14 != pBVar10->index);
          }
        }
      }
      free(local_80.memory);
      free(local_80.freelist);
      free(local_80.chains0);
      free(local_80.chains1);
      goto LAB_0011ad66;
    }
    lengths[0] = 1;
    lengths[1] = 1;
  }
  uVar14 = 0;
LAB_0011ad66:
  free(leaves);
  return uVar14;
}

Assistant:

unsigned lodepng_huffman_code_lengths(unsigned* lengths, const unsigned* frequencies,
                                      size_t numcodes, unsigned maxbitlen) {
  unsigned error = 0;
  unsigned i;
  size_t numpresent = 0; /*number of symbols with non-zero frequency*/
  BPMNode* leaves; /*the symbols, only those with > 0 frequency*/

  if(numcodes == 0) return 80; /*error: a tree of 0 symbols is not supposed to be made*/
  if((1u << maxbitlen) < (unsigned)numcodes) return 80; /*error: represent all symbols*/

  leaves = (BPMNode*)lodepng_malloc(numcodes * sizeof(*leaves));
  if(!leaves) return 83; /*alloc fail*/

  for(i = 0; i != numcodes; ++i) {
    if(frequencies[i] > 0) {
      leaves[numpresent].weight = (int)frequencies[i];
      leaves[numpresent].index = i;
      ++numpresent;
    }
  }

  lodepng_memset(lengths, 0, numcodes * sizeof(*lengths));

  /*ensure at least two present symbols. There should be at least one symbol
  according to RFC 1951 section 3.2.7. Some decoders incorrectly require two. To
  make these work as well ensure there are at least two symbols. The
  Package-Merge code below also doesn't work correctly if there's only one
  symbol, it'd give it the theoretical 0 bits but in practice zlib wants 1 bit*/
  if(numpresent == 0) {
    lengths[0] = lengths[1] = 1; /*note that for RFC 1951 section 3.2.7, only lengths[0] = 1 is needed*/
  } else if(numpresent == 1) {
    lengths[leaves[0].index] = 1;
    lengths[leaves[0].index == 0 ? 1 : 0] = 1;
  } else {
    BPMLists lists;
    BPMNode* node;

    bpmnode_sort(leaves, numpresent);

    lists.listsize = maxbitlen;
    lists.memsize = 2 * maxbitlen * (maxbitlen + 1);
    lists.nextfree = 0;
    lists.numfree = lists.memsize;
    lists.memory = (BPMNode*)lodepng_malloc(lists.memsize * sizeof(*lists.memory));
    lists.freelist = (BPMNode**)lodepng_malloc(lists.memsize * sizeof(BPMNode*));
    lists.chains0 = (BPMNode**)lodepng_malloc(lists.listsize * sizeof(BPMNode*));
    lists.chains1 = (BPMNode**)lodepng_malloc(lists.listsize * sizeof(BPMNode*));
    if(!lists.memory || !lists.freelist || !lists.chains0 || !lists.chains1) error = 83; /*alloc fail*/

    if(!error) {
      for(i = 0; i != lists.memsize; ++i) lists.freelist[i] = &lists.memory[i];

      bpmnode_create(&lists, leaves[0].weight, 1, 0);
      bpmnode_create(&lists, leaves[1].weight, 2, 0);

      for(i = 0; i != lists.listsize; ++i) {
        lists.chains0[i] = &lists.memory[0];
        lists.chains1[i] = &lists.memory[1];
      }

      /*each boundaryPM call adds one chain to the last list, and we need 2 * numpresent - 2 chains.*/
      for(i = 2; i != 2 * numpresent - 2; ++i) boundaryPM(&lists, leaves, numpresent, (int)maxbitlen - 1, (int)i);

      for(node = lists.chains1[maxbitlen - 1]; node; node = node->tail) {
        for(i = 0; i != node->index; ++i) ++lengths[leaves[i].index];
      }
    }

    lodepng_free(lists.memory);
    lodepng_free(lists.freelist);
    lodepng_free(lists.chains0);
    lodepng_free(lists.chains1);
  }

  lodepng_free(leaves);
  return error;
}